

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int TPZMatrix<Fad<long_double>_>::Error(char *msg,char *msg2)

{
  ostream *poVar1;
  bad_exception myex;
  ostringstream out;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  poVar1 = std::operator<<((ostream *)&out,"TPZMatrix::");
  std::operator<<(poVar1,msg);
  if (msg2 != (char *)0x0) {
    std::operator<<((ostream *)&out,msg2);
  }
  std::operator<<((ostream *)&out,".\n");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&myex);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&myex);
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cout,_myex);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&myex);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x48e);
}

Assistant:

int TPZMatrix<TVar>::Error(const char *msg ,const char *msg2) {
  ostringstream out;
  out << "TPZMatrix::" << msg;
  if(msg2) out << msg2;
  out << ".\n";
  std::cout<<out.str()<<std::endl;
  LOGPZ_ERROR (logger, out.str().c_str());
  DebugStop();
	std::bad_exception myex;
	throw myex;
}